

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  uint *puVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  secp256k1_gej *psVar5;
  uchar *r_00;
  uint uVar6;
  secp256k1_fe *a;
  code *pcVar7;
  bool bVar8;
  int is_nonce_valid;
  int vflag;
  secp256k1_scalar n;
  unsigned_long _zzq_result;
  uchar nonce32 [32];
  unsigned_long _zzq_args [6];
  uchar b [32];
  secp256k1_scalar asStack_254 [13];
  secp256k1_gej *psStack_220;
  secp256k1_scalar local_214 [2];
  secp256k1_scalar local_20c [4];
  secp256k1_scalar local_1fc;
  secp256k1_scalar local_1f8;
  int local_1f4;
  uint *local_1f0;
  undefined8 local_1e8;
  secp256k1_ge *local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  uchar *local_1b8;
  secp256k1_context *local_1b0;
  uint local_1a8;
  secp256k1_scalar local_1a4;
  uint *local_1a0;
  secp256k1_ge local_198;
  uchar *local_128;
  secp256k1_nonce_function local_120;
  uchar local_118 [32];
  secp256k1_gej local_f8;
  uchar local_58 [40];
  
  local_214[0] = 0;
  *r = 0;
  *s = 0;
  if (recid != (int *)0x0) {
    *recid = 0;
  }
  psStack_220 = (secp256k1_gej *)0x10818a;
  local_1f0 = r;
  local_1b8 = seckey;
  local_1b0 = ctx;
  local_1a8 = secp256k1_scalar_set_b32_seckey(local_20c,seckey);
  local_1e8 = CONCAT44(local_1e8._4_4_,local_1a8) ^ 1;
  local_f8.x.n[0] = 0x4d430005;
  local_f8.x.n[2] = 4;
  local_f8.x.n[3] = 0;
  local_f8.x.n[4] = 0;
  local_f8.x.magnitude = 0;
  local_f8.x.normalized = 0;
  local_198.x.n[0] = 0;
  local_20c[0] = (local_1a8 ^ 1) & 1 | (local_1a8 ^ 1) - 1 & local_20c[0];
  psStack_220 = (secp256k1_gej *)0x1081fa;
  local_f8.x.n[1] = (uint64_t)local_20c;
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)local_20c[0]);
  lVar3 = 0;
  local_1f8 = 0;
  do {
    uVar4 = (uint)msg32[lVar3] | local_1f8 << 8;
    local_1f8 = uVar4 - (uVar4 / 0xd + (uVar4 / 0xd) * 0xc);
    if (uVar4 < 0xd) {
      local_1f8 = uVar4;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x20);
  pcVar7 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    pcVar7 = noncefp;
  }
  psStack_220 = (secp256k1_gej *)0x108243;
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)local_1f8);
  psStack_220 = (secp256k1_gej *)0x10826b;
  r_00 = msg32;
  local_120 = pcVar7;
  iVar2 = (*pcVar7)(local_118,msg32,local_1b8,(uchar *)0x0,noncedata,0);
  uVar4 = 0;
  bVar8 = iVar2 != 0;
  if (bVar8) {
    psVar5 = (secp256k1_gej *)0x1;
    local_1a0 = (uint *)recid;
    local_128 = msg32;
    do {
      local_214[0] = (secp256k1_scalar)bVar8;
      psStack_220 = (secp256k1_gej *)0x1082a6;
      local_1fc = secp256k1_scalar_set_b32_seckey(local_214 + 1,local_118);
      if (local_1b0->declassify != 0) {
        local_f8.x.n[0] = 0x4d430002;
        local_f8.x.n[1] = (uint64_t)&local_1fc;
        local_f8.x.n[2] = 4;
        local_f8.x.n[3] = 0;
        local_f8.x.n[4] = 0;
        local_f8.x.magnitude = 0;
        local_f8.x.normalized = 0;
        local_198.x.n[0] = 0;
      }
      if (local_1fc != 0) {
        local_1f4 = 0;
        psStack_220 = (secp256k1_gej *)0x1082e6;
        secp256k1_ecmult_gen(&local_1b0->ecmult_gen_ctx,&local_f8,local_214 + 1);
        psStack_220 = (secp256k1_gej *)0x1082fc;
        secp256k1_ge_set_gej(&local_198,&local_f8);
        psStack_220 = (secp256k1_gej *)0x108304;
        secp256k1_fe_normalize(&local_198.x);
        psStack_220 = (secp256k1_gej *)0x108311;
        secp256k1_fe_normalize(&local_198.y);
        r_00 = local_58;
        psStack_220 = (secp256k1_gej *)0x108324;
        secp256k1_fe_get_b32(r_00,&local_198.x);
        psStack_220 = (secp256k1_gej *)0x108336;
        secp256k1_scalar_set_b32(local_1f0,r_00,&local_1f4);
        iVar2 = local_1f4;
        if ((uint *)recid != (uint *)0x0) {
          a = &local_198.y;
          psStack_220 = (secp256k1_gej *)0x10834d;
          secp256k1_fe_verify(a);
          if (local_198.y.normalized == 0) {
            psStack_220 = (secp256k1_gej *)0x108922;
            secp256k1_ecdsa_sign_inner_cold_1();
            goto LAB_00108922;
          }
          *recid = ((uint)local_198.y.n[0] & 1) + iVar2 * 2;
        }
        psStack_220 = (secp256k1_gej *)0x108383;
        secp256k1_scalar_mul(&local_1a4,local_1f0,local_20c);
        psStack_220 = (secp256k1_gej *)0x108393;
        secp256k1_scalar_add(&local_1a4,&local_1a4,&local_1f8);
        psStack_220 = (secp256k1_gej *)0x1083a0;
        secp256k1_scalar_inverse(s,local_214 + 1);
        psStack_220 = (secp256k1_gej *)0x1083ae;
        secp256k1_scalar_mul(s,s,&local_1a4);
        local_1a4 = 0;
        local_1e8 = 0x4d430001;
        local_1d8 = 4;
        local_1d0 = 0;
        local_1c8 = 0;
        local_1c0 = 0;
        local_20c[1] = 0;
        local_20c[2] = 0;
        r_00 = (uchar *)0x0;
        psStack_220 = (secp256k1_gej *)0x10841f;
        local_1e0 = (secp256k1_ge *)&local_1a4;
        memset(&local_f8,0,0x98);
        local_198.x.n[0] = 0;
        local_198.x.n[1] = 0;
        local_198.x.n[2] = 0;
        local_198.x.n[3] = 0;
        local_198.x.n[4] = 0;
        local_198.x.magnitude = 0;
        local_198.x.normalized = 0;
        local_198.y.n[0] = 0;
        local_198.y.n[1] = 0;
        local_198.y.n[2] = 0;
        local_198.y.n[3] = 0;
        local_198.y.n[4] = 0;
        local_198.y.magnitude = 0;
        local_198.y.normalized = 0;
        local_198.infinity = 0;
        local_198._100_4_ = 0;
        local_1e0 = &local_198;
        local_1e8 = 0x4d430001;
        local_1d8 = 0x68;
        local_1d0 = 0;
        local_1c8 = 0;
        local_1c0 = 0;
        local_20c[1] = 0;
        local_20c[2] = 0;
        psStack_220 = (secp256k1_gej *)0x1084f2;
        secp256k1_scalar_verify((secp256k1_scalar *)(ulong)*s);
        uVar4 = *s;
        psStack_220 = (secp256k1_gej *)0x1084fd;
        secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar4);
        if (6 < uVar4) {
          psStack_220 = (secp256k1_gej *)0x108512;
          secp256k1_scalar_verify((secp256k1_scalar *)(ulong)*s);
          uVar6 = 0xd - *s;
          if (*s == 0) {
            uVar6 = 0;
          }
          *s = uVar6;
          psStack_220 = (secp256k1_gej *)0x108529;
          secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar6);
        }
        psStack_220 = (secp256k1_gej *)0x108531;
        secp256k1_scalar_verify((secp256k1_scalar *)(ulong)*s);
        puVar1 = local_1f0;
        if (local_1a0 != (uint *)0x0) {
          *local_1a0 = *local_1a0 ^ (uint)(6 < uVar4);
        }
        psStack_220 = (secp256k1_gej *)0x10854f;
        secp256k1_scalar_verify((secp256k1_scalar *)(ulong)*local_1f0);
        uVar4 = *puVar1;
        psStack_220 = (secp256k1_gej *)0x108560;
        secp256k1_scalar_verify((secp256k1_scalar *)(ulong)*s);
        bVar8 = *s != 0 && uVar4 != 0;
        local_214[0] = (secp256k1_scalar)bVar8;
        if (local_1b0->declassify != 0) {
          local_f8.x.n[0] = 0x4d430002;
          local_f8.x.n[1] = (uint64_t)local_214;
          local_f8.x.n[2] = 4;
          local_f8.x.n[3] = 0;
          local_f8.x.n[4] = 0;
          local_f8.x.magnitude = 0;
          local_f8.x.normalized = 0;
          local_198.x.n[0] = 0;
        }
        uVar4 = (uint)bVar8;
        msg32 = local_128;
        recid = (int *)local_1a0;
        if (uVar4 != 0) break;
      }
      uVar4 = 0;
      psStack_220 = (secp256k1_gej *)0x1085c2;
      r_00 = msg32;
      iVar2 = (*local_120)(local_118,msg32,local_1b8,(uchar *)0x0,noncedata,(uint)psVar5);
      psVar5 = (secp256k1_gej *)(ulong)((uint)psVar5 + 1);
      bVar8 = iVar2 != 0;
    } while (bVar8);
  }
  local_214[0] = uVar4 & local_1a8;
  local_118[0] = '\0';
  local_118[1] = '\0';
  local_118[2] = '\0';
  local_118[3] = '\0';
  local_118[4] = '\0';
  local_118[5] = '\0';
  local_118[6] = '\0';
  local_118[7] = '\0';
  local_118[8] = '\0';
  local_118[9] = '\0';
  local_118[10] = '\0';
  local_118[0xb] = '\0';
  local_118[0xc] = '\0';
  local_118[0xd] = '\0';
  local_118[0xe] = '\0';
  local_118[0xf] = '\0';
  local_118[0x10] = '\0';
  local_118[0x11] = '\0';
  local_118[0x12] = '\0';
  local_118[0x13] = '\0';
  local_118[0x14] = '\0';
  local_118[0x15] = '\0';
  local_118[0x16] = '\0';
  local_118[0x17] = '\0';
  local_118[0x18] = '\0';
  local_118[0x19] = '\0';
  local_118[0x1a] = '\0';
  local_118[0x1b] = '\0';
  local_118[0x1c] = '\0';
  local_118[0x1d] = '\0';
  local_118[0x1e] = '\0';
  local_118[0x1f] = '\0';
  local_1f8 = 0;
  local_214[1] = 0;
  local_20c[0] = 0;
  local_f8.x.n[0] = 0x4d430005;
  local_f8.x.n[1] = (uint64_t)local_1f0;
  local_f8.x.n[2] = 4;
  local_f8.x.n[3] = 0;
  local_f8.x.n[4] = 0;
  local_f8.x.magnitude = 0;
  local_f8.x.normalized = 0;
  psVar5 = &local_f8;
  local_198.x.n[0] = 0;
  uVar4 = (local_214[0] == 0) - 1 & *local_1f0;
  *local_1f0 = uVar4;
  psStack_220 = (secp256k1_gej *)0x108878;
  local_1e8._0_4_ = (uint)(local_214[0] == 0);
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar4);
  local_1e8 = CONCAT44(local_1e8._4_4_,(uint)(local_214[0] == 0));
  local_f8.x.n[0] = 0x4d430005;
  local_f8.x.n[2] = 4;
  local_f8.x.n[3] = 0;
  local_f8.x.n[4] = 0;
  local_f8.x.magnitude = 0;
  local_f8.x.normalized = 0;
  local_198.x.n[0] = 0;
  uVar4 = (local_214[0] == 0) - 1 & *s;
  a = (secp256k1_fe *)(ulong)uVar4;
  *s = uVar4;
  psStack_220 = (secp256k1_gej *)0x1088da;
  local_f8.x.n[1] = (uint64_t)s;
  secp256k1_scalar_verify((secp256k1_scalar *)a);
  if ((uint *)recid == (uint *)0x0) {
    return local_214[0];
  }
  local_f8.x.n[0] = CONCAT44(local_f8.x.n[0]._4_4_,(uint)(local_214[0] == 0));
  if (-1 < *recid) {
    *recid = (local_214[0] == 0) + 0x7fffffff & *recid;
    return local_214[0];
  }
LAB_00108922:
  psStack_220 = (secp256k1_gej *)secp256k1_ec_seckey_verify;
  secp256k1_ecdsa_sign_inner_cold_2();
  psStack_220 = psVar5;
  if (a == (secp256k1_fe *)0x0) {
    secp256k1_ec_seckey_verify_cold_2();
  }
  else if (r_00 != (uchar *)0x0) {
    iVar2 = secp256k1_scalar_set_b32_seckey(asStack_254,r_00);
    return iVar2;
  }
  secp256k1_ec_seckey_verify_cold_1();
  return 0;
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    secp256k1_memclear(nonce32, sizeof(nonce32));
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}